

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_Base2_Test::iu_AssertionTest_x_iutest_x_Base2_Test
          (iu_AssertionTest_x_iutest_x_Base2_Test *this)

{
  iu_AssertionTest_x_iutest_x_Base2_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_AssertionTest_x_iutest_x_Base2_Test_0039d478;
  return;
}

Assistant:

IUTEST(AssertionTest, Base2)
{
    // NULL
    {
        int* p1 = NULL;
        IUTEST_EXPECT_NULL(p1);

        void* p2 = &p1;
        IUTEST_EXPECT_NOTNULL(p2);
    }
    // SAME
    {
        int v = 0;
        int* p1 = &v;
        IUTEST_EXPECT_SAME(v, *p1);
    }
    // EQ_COLLECTIONS/EQ_RANGE
    {
        int aa[] ={ 0, 1, 2, 3, 4 };
        int ab[] ={ 0, 1, 2, 3, 4 };
        IUTEST_EXPECT_EQ_COLLECTIONS(aa, aa+(sizeof(aa)/sizeof(aa[0])), ab, ab+(sizeof(ab)/sizeof(ab[0])));
#if !defined(IUTEST_NO_TEMPLATE_PARTIAL_SPECIALIZATION)
        IUTEST_EXPECT_EQ_RANGE(aa, ab);
#endif
    }
    // NE_COLLECTIONS/NE_RANGE
    // NE_COLLECTIONS
    {
        int aa[] ={ 0, 1, 2, 3, 4 };
        int ab[] ={ 9, 1, 2, 3, 4 };
        IUTEST_EXPECT_NE_COLLECTIONS(aa, aa+(sizeof(aa)/sizeof(aa[0])), ab, ab+(sizeof(ab)/sizeof(ab[0])));
#if !defined(IUTEST_NO_TEMPLATE_PARTIAL_SPECIALIZATION)
        IUTEST_EXPECT_NE_RANGE(aa, ab);
#endif
    }
}